

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall google::protobuf::Arena::CleanupList(Arena *this)

{
  undefined8 *local_18;
  Node *head;
  Arena *this_local;
  
  for (local_18 = (undefined8 *)internal::NoBarrier_Load((Atomic64 *)(this + 0x20));
      local_18 != (undefined8 *)0x0; local_18 = (undefined8 *)local_18[2]) {
    (*(code *)local_18[1])(*local_18);
  }
  *(undefined8 *)(this + 0x20) = 0;
  return;
}

Assistant:

void Arena::CleanupList() {
  Node* head =
      reinterpret_cast<Node*>(google::protobuf::internal::NoBarrier_Load(&cleanup_list_));
  while (head != NULL) {
    head->cleanup(head->elem);
    head = head->next;
  }
  cleanup_list_ = 0;
}